

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 *puVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  int iVar4;
  pointer pMVar5;
  Mat *pMVar6;
  long lVar7;
  void *in_R8;
  long lVar8;
  Mat local_70;
  
  iVar4 = -1;
  if (this->support_inplace == true) {
    pMVar5 = (pointer)opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    if (0 < (int)((ulong)((long)(top_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        Mat::clone(&local_70,
                   (__fn *)((long)&((bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->data + lVar7),
                   opt->blob_allocator,(int)pMVar5,in_R8);
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar6 = (Mat *)((long)&pMVar5->data + lVar7);
        if (pMVar6 != &local_70) {
          if (local_70.refcount != (int *)0x0) {
            LOCK();
            *local_70.refcount = *local_70.refcount + 1;
            UNLOCK();
          }
          piVar2 = *(int **)((long)&pMVar5->refcount + lVar7);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              __ptr = *(void **)((long)&pMVar5->data + lVar7);
              plVar3 = *(long **)((long)&pMVar5->allocator + lVar7);
              if (plVar3 == (long *)0x0) {
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar6->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar6->elemsize + 4) = 0;
          pMVar6->data = (void *)0x0;
          pMVar6->refcount = (int *)0x0;
          puVar1 = (undefined8 *)((long)&pMVar5->dims + lVar7);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)&pMVar5->cstep + lVar7) = 0;
          *(void **)((long)&pMVar5->data + lVar7) = local_70.data;
          *(int **)((long)&pMVar5->refcount + lVar7) = local_70.refcount;
          *(size_t *)((long)&pMVar5->elemsize + lVar7) = local_70.elemsize;
          *(int *)((long)&pMVar5->elempack + lVar7) = local_70.elempack;
          *(Allocator **)((long)&pMVar5->allocator + lVar7) = local_70.allocator;
          piVar2 = (int *)((long)&pMVar5->dims + lVar7);
          *piVar2 = local_70.dims;
          piVar2[1] = local_70.w;
          piVar2[2] = local_70.h;
          piVar2[3] = local_70.c;
          *(size_t *)((long)&pMVar5->cstep + lVar7) = local_70.cstep;
        }
        if (local_70.refcount != (int *)0x0) {
          LOCK();
          *local_70.refcount = *local_70.refcount + -1;
          UNLOCK();
          if (*local_70.refcount == 0) {
            if (local_70.allocator == (Allocator *)0x0) {
              if (local_70.data != (void *)0x0) {
                free(local_70.data);
              }
            }
            else {
              (*(local_70.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(long *)((long)&pMVar5->data + lVar7) == 0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar5->c + lVar7) * *(long *)((long)&pMVar5->cstep + lVar7) == 0)
        {
          return -100;
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + 0x40;
      } while (lVar8 < (int)((ulong)((long)(top_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)pMVar5) >> 6));
    }
    iVar4 = (*this->_vptr_Layer[8])(this,top_blobs,opt);
  }
  return iVar4;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}